

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O0

void __thiscall vector_brodnik<unsigned_long>::clear(vector_brodnik<unsigned_long> *this)

{
  size_type sVar1;
  reference ppuVar2;
  uint local_14;
  uint i;
  vector_brodnik<unsigned_long> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                      (&this->_index_block);
    if (sVar1 <= local_14) break;
    ppuVar2 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                        (&this->_index_block,(ulong)local_14);
    free(*ppuVar2);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::clear(&this->_index_block);
  this->_insertpos = (unsigned_long *)0x0;
  this->_left_in_block = 0;
  this->_left_in_superblock = 8;
  this->_block_size = 8;
  this->_superblock_size = 8;
  this->_superblock = '\x06';
  return;
}

Assistant:

void clear()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos = 0;
		_left_in_block = 0;
		_left_in_superblock = InitialSuperBlocksize;
		_block_size = InitialBlocksize;
		_superblock_size = InitialSuperBlocksize;
		_superblock = InitialSuperBlock;
	}